

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O2

void lh_rebucket(_LHASH *lh,size_t new_num_buckets)

{
  size_t sVar1;
  lhash_item_st *plVar2;
  LHASH_ITEM **ppLVar3;
  ulong uVar4;
  size_t sVar5;
  LHASH_ITEM *pLVar6;
  
  if ((new_num_buckets >> 0x3d == 0) &&
     (ppLVar3 = (LHASH_ITEM **)OPENSSL_zalloc(new_num_buckets * 8), ppLVar3 != (LHASH_ITEM **)0x0))
  {
    sVar1 = lh->num_buckets;
    for (sVar5 = 0; sVar5 != sVar1; sVar5 = sVar5 + 1) {
      pLVar6 = lh->buckets[sVar5];
      while (pLVar6 != (LHASH_ITEM *)0x0) {
        uVar4 = (ulong)pLVar6->hash % new_num_buckets;
        plVar2 = pLVar6->next;
        pLVar6->next = ppLVar3[uVar4];
        ppLVar3[uVar4] = pLVar6;
        pLVar6 = plVar2;
      }
    }
    OPENSSL_free(lh->buckets);
    lh->num_buckets = new_num_buckets;
    lh->buckets = ppLVar3;
  }
  return;
}

Assistant:

static void lh_rebucket(_LHASH *lh, const size_t new_num_buckets) {
  LHASH_ITEM **new_buckets, *cur, *next;
  size_t i, alloc_size;

  alloc_size = sizeof(LHASH_ITEM *) * new_num_buckets;
  if (alloc_size / sizeof(LHASH_ITEM *) != new_num_buckets) {
    return;
  }

  new_buckets = reinterpret_cast<LHASH_ITEM **>(OPENSSL_zalloc(alloc_size));
  if (new_buckets == NULL) {
    return;
  }

  for (i = 0; i < lh->num_buckets; i++) {
    for (cur = lh->buckets[i]; cur != NULL; cur = next) {
      const size_t new_bucket = cur->hash % new_num_buckets;
      next = cur->next;
      cur->next = new_buckets[new_bucket];
      new_buckets[new_bucket] = cur;
    }
  }

  OPENSSL_free(lh->buckets);

  lh->num_buckets = new_num_buckets;
  lh->buckets = new_buckets;
}